

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O3

QAbstractAnimation * __thiscall QAnimationGroup::takeAnimation(QAnimationGroup *this,int index)

{
  long *plVar1;
  ulong i;
  QObject *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  i = (ulong)(uint)index;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    plVar1 = *(long **)(this + 8);
    if (i < (ulong)plVar1[0x16]) {
      this_00 = *(QObject **)(plVar1[0x15] + i * 8);
      (this_00->d_ptr).d[1].bindingStorage.bindingStatus = (QBindingStatus *)0x0;
      QList<QAbstractAnimation_*>::removeAt((QList<QAbstractAnimation_*> *)(plVar1 + 0x14),i);
      QObject::setParent(this_00,(QObject *)0x0);
      (**(code **)(*plVar1 + 0x28))(plVar1,i,this_00);
      goto LAB_003a797f;
    }
  }
  local_40.context.version = 2;
  local_40.context._4_8_ = 0;
  local_40.context._12_8_ = 0;
  local_40.context.function._4_4_ = 0;
  local_40.context.category = "default";
  this_00 = (QObject *)0x0;
  QMessageLogger::warning(&local_40,"QAnimationGroup::takeAnimation: no animation at index %d");
LAB_003a797f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QAbstractAnimation *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractAnimation *QAnimationGroup::takeAnimation(int index)
{
    Q_D(QAnimationGroup);
    if (index < 0 || index >= d->animations.size()) {
        qWarning("QAnimationGroup::takeAnimation: no animation at index %d", index);
        return nullptr;
    }
    QAbstractAnimation *animation = d->animations.at(index);
    QAbstractAnimationPrivate::get(animation)->group = nullptr;
    // ### removing from list before doing setParent to avoid infinite recursion
    // in ChildRemoved event
    d->animations.removeAt(index);
    animation->setParent(nullptr);
    d->animationRemoved(index, animation);
    return animation;
}